

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalGhsMultiGenerator::AddCheckTarget(cmGlobalGhsMultiGenerator *this)

{
  __uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> this_00;
  pointer puVar1;
  cmake *this_01;
  __single_object _Var2;
  __single_object this_02;
  _Alloc_hider __p;
  bool bVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  string *psVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  cmTarget *pcVar8;
  cmSourceFile *this_03;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *gen;
  pointer puVar9;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_01;
  __single_object cc;
  allocator<char> local_2d1;
  __single_object ptr;
  cmAlphaNum local_2c8;
  string argS;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  listFiles;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_260;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_258;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_250;
  cmCustomCommandLines commandLines;
  cmTarget *tgt;
  string argB;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  string local_1c8;
  ostringstream msg;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msg,"CMAKE_SUPPRESS_REGENERATION",(allocator<char> *)&local_2c8);
  bVar3 = cmGlobalGenerator::GlobalSettingIsOn(&this->super_cmGlobalGenerator,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  if (!bVar3) {
    this_00._M_t.super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
    super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl =
         (((this->super_cmGlobalGenerator).LocalGenerators.
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t;
    psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                       ((cmLocalGenerator *)
                        this_00._M_t.
                        super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                        .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&argS,"/CMakeFiles/",(allocator<char> *)&argB);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c8,
                   psVar6,&argS);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c8,
                   CHECK_BUILD_SYSTEM_TARGET);
    psVar6 = &this->StampFile;
    std::__cxx11::string::operator=((string *)psVar6,(string *)&msg);
    std::__cxx11::string::~string((string *)&msg);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&argS);
    listFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    listFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    listFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar1 = (this->super_cmGlobalGenerator).LocalGenerators.
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar9 = (this->super_cmGlobalGenerator).LocalGenerators.
                  super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar1; puVar9 = puVar9 + 1)
    {
      ::cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                (&listFiles,
                 &((puVar9->_M_t).
                   super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                   .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile->
                  ListFiles);
    }
    psVar7 = cmake::GetHomeOutputDirectory_abi_cxx11_((this->super_cmGlobalGenerator).CMakeInstance)
    ;
    _msg = (cmLocalGenerator *)psVar7->_M_string_length;
    local_2c8.View_._M_len = 0xf;
    local_2c8.View_._M_str = "/CMakeCache.txt";
    cmStrCat<>(&argS,(cmAlphaNum *)&msg,&local_2c8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&listFiles,&argS
              );
    std::__cxx11::string::~string((string *)&argS);
    bVar4 = cmake::DoWriteGlobVerifyTarget((this->super_cmGlobalGenerator).CMakeInstance);
    if (bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
      std::operator<<((ostream *)&msg,
                      "Any pre-check scripts, such as those generated for file(GLOB CONFIGURE_DEPENDS), will not be run by gbuild."
                     );
      this_01 = (this->super_cmGlobalGenerator).CMakeInstance;
      std::__cxx11::stringbuf::str();
      argS._M_dataplus._M_p = (pointer)0x0;
      argS._M_string_length = 0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&argS);
      cmake::IssueMessage(this_01,AUTHOR_WARNING,(string *)&local_2c8,(cmListFileBacktrace *)&argS);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&argS._M_string_length);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
              (listFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               listFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    __first = std::
              __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        (listFiles.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         listFiles.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&listFiles,(const_iterator)__first._M_current,
            (const_iterator)
            listFiles.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish);
    commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    _msg = (cmLocalGenerator *)psVar7->_M_string_length;
    ilist._M_len = 5;
    ilist._M_array = (iterator)&msg;
    cmMakeCommandLine((cmCustomCommandLine *)&local_2c8,ilist);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
    emplace_back<cmCustomCommandLine>
              (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
               ,(cmCustomCommandLine *)&local_2c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_2c8);
    _msg = (cmLocalGenerator *)0x2;
    psVar7 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_
                       ((cmLocalGenerator *)
                        this_00._M_t.
                        super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                        .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
    local_2c8.View_._M_str = (psVar7->_M_dataplus)._M_p;
    local_2c8.View_._M_len = psVar7->_M_string_length;
    cmStrCat<>(&argS,(cmAlphaNum *)&msg,&local_2c8);
    _msg = (cmLocalGenerator *)0x2;
    psVar7 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                       ((cmLocalGenerator *)
                        this_00._M_t.
                        super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                        .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
    local_2c8.View_._M_str = (psVar7->_M_dataplus)._M_p;
    local_2c8.View_._M_len = psVar7->_M_string_length;
    cmStrCat<>(&argB,(cmAlphaNum *)&msg,&local_2c8);
    psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    _msg = (cmLocalGenerator *)psVar7->_M_string_length;
    ilist_00._M_len = 3;
    ilist_00._M_array = (iterator)&msg;
    cmMakeCommandLine((cmCustomCommandLine *)&local_2c8,ilist_00);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
    emplace_back<cmCustomCommandLine>
              (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
               ,(cmCustomCommandLine *)&local_2c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_2c8);
    psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    _msg = (cmLocalGenerator *)psVar7->_M_string_length;
    ilist_01._M_len = 4;
    ilist_01._M_array = (iterator)&msg;
    cmMakeCommandLine((cmCustomCommandLine *)&local_2c8,ilist_01);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
    emplace_back<cmCustomCommandLine>
              (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
               ,(cmCustomCommandLine *)&local_2c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_2c8);
    std::make_unique<cmCustomCommand>();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,CHECK_BUILD_SYSTEM_TARGET,(allocator<char> *)&local_2c8);
    local_250._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
    _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
         super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
         super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
    cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x0;
    pcVar8 = cmLocalGenerator::AddUtilityCommand
                       ((cmLocalGenerator *)
                        this_00._M_t.
                        super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                        .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,
                        (string *)&msg,true,&local_250);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_250)
    ;
    std::__cxx11::string::~string((string *)&msg);
    tgt = pcVar8;
    _msg = (cmLocalGenerator *)
           this_00._M_t.
           super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
           super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
    std::make_unique<cmGeneratorTarget,cmTarget*&,cmLocalGhsMultiGenerator*>
              ((cmTarget **)&ptr,(cmLocalGhsMultiGenerator **)&tgt);
    this_02 = ptr;
    local_258._M_t.super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
    ._M_t.super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
    super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
         ptr._M_t.super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
         _M_t.super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
         super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
    ptr._M_t.super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>._M_t.
    super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
    super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true>)
         (__uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>)0x0;
    cmLocalGenerator::AddGeneratorTarget
              ((cmLocalGenerator *)
               this_00._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,&local_258);
    std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
              (&local_258);
    std::make_unique<cmCustomCommand>();
    __p._M_p = (pointer)_msg;
    _msg = (cmLocalGenerator *)0x0;
    std::__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::reset
              ((__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&cc,
               (pointer)__p._M_p);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&msg);
    _Var2 = cc;
    std::__cxx11::string::string((string *)&local_1c8,(string *)psVar6);
    cmCustomCommand::SetOutputs
              ((cmCustomCommand *)
               _Var2._M_t.
               super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    _Var2 = cc;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1e0,&listFiles);
    cmCustomCommand::SetDepends
              ((cmCustomCommand *)
               _Var2._M_t.
               super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_1e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1e0);
    _Var2 = cc;
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              (&local_1f8,
               &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
              );
    cmCustomCommand::SetCommandLines
              ((cmCustomCommand *)
               _Var2._M_t.
               super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
               (cmCustomCommandLines *)&local_1f8);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_1f8);
    cmCustomCommand::SetComment
              ((cmCustomCommand *)
               cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,"Checking Build System")
    ;
    cmCustomCommand::SetCMP0116Status
              ((cmCustomCommand *)
               cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,NEW);
    cmCustomCommand::SetEscapeOldStyle
              ((cmCustomCommand *)
               cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,false);
    *(undefined1 *)
     ((long)cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
            _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
            super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl + 0x12d) = 1;
    local_260._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
    _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
         super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
         super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
    cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x0;
    this_03 = cmLocalGenerator::AddCustomCommandToOutput
                        ((cmLocalGenerator *)
                         this_00._M_t.
                         super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                         .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,&local_260,
                         true);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_260)
    ;
    if (this_03 == (cmSourceFile *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
                     "Error adding rule for ",psVar6);
      cmSystemTools::Error((string *)&msg);
      std::__cxx11::string::~string((string *)&msg);
    }
    else {
      psVar6 = cmSourceFile::ResolveFullPath(this_03,(string *)0x0,(string *)0x0);
      cmGeneratorTarget::AddSource
                ((cmGeneratorTarget *)
                 this_02._M_t.
                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                 .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,psVar6,false);
    }
    iVar5 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x2c])(this);
    pcVar8 = tgt;
    if ((char)iVar5 != '\0') {
      std::__cxx11::string::string<std::allocator<char>>((string *)&msg,"FOLDER",&local_2d1);
      cmGlobalGenerator::GetPredefinedTargetsFolder_abi_cxx11_
                ((string *)&local_2c8,&this->super_cmGlobalGenerator);
      cmTarget::SetProperty(pcVar8,(string *)&msg,(string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&msg);
    }
    std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr(&ptr);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&cc);
    std::__cxx11::string::~string((string *)&argB);
    std::__cxx11::string::~string((string *)&argS);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
              (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&listFiles);
  }
  return !bVar3;
}

Assistant:

bool cmGlobalGhsMultiGenerator::AddCheckTarget()
{
  // Skip the target if no regeneration is to be done.
  if (this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION")) {
    return false;
  }

  // Get the generators.
  std::vector<std::unique_ptr<cmLocalGenerator>> const& generators =
    this->LocalGenerators;
  auto& lg =
    cm::static_reference_cast<cmLocalGhsMultiGenerator>(generators[0]);

  // The name of the output file for the custom command.
  this->StampFile = lg.GetBinaryDirectory() + std::string("/CMakeFiles/") +
    CHECK_BUILD_SYSTEM_TARGET;

  // Add a custom rule to re-run CMake if any input files changed.
  {
    // Collect the input files used to generate all targets in this
    // project.
    std::vector<std::string> listFiles;
    for (const auto& gen : generators) {
      cm::append(listFiles, gen->GetMakefile()->GetListFiles());
    }

    // Add the cache file.
    listFiles.push_back(cmStrCat(
      this->GetCMakeInstance()->GetHomeOutputDirectory(), "/CMakeCache.txt"));

    // Print not implemented warning.
    if (this->GetCMakeInstance()->DoWriteGlobVerifyTarget()) {
      std::ostringstream msg;
      msg << "Any pre-check scripts, such as those generated for file(GLOB "
             "CONFIGURE_DEPENDS), will not be run by gbuild.";
      this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                             msg.str());
    }

    // Sort the list of input files and remove duplicates.
    std::sort(listFiles.begin(), listFiles.end(), std::less<std::string>());
    auto newEnd = std::unique(listFiles.begin(), listFiles.end());
    listFiles.erase(newEnd, listFiles.end());

    // Create a rule to re-run CMake and create output file.
    cmCustomCommandLines commandLines;
    commandLines.emplace_back(
      cmMakeCommandLine({ cmSystemTools::GetCMakeCommand(), "-E", "rm", "-f",
                          this->StampFile }));
    std::string argS = cmStrCat("-S", lg.GetSourceDirectory());
    std::string argB = cmStrCat("-B", lg.GetBinaryDirectory());
    commandLines.emplace_back(
      cmMakeCommandLine({ cmSystemTools::GetCMakeCommand(), argS, argB }));
    commandLines.emplace_back(cmMakeCommandLine(
      { cmSystemTools::GetCMakeCommand(), "-E", "touch", this->StampFile }));

    /* Create the target(Exclude from ALL_BUILD).
     *
     * The build tool, currently, does not support rereading the project files
     * if they get updated. So do not run this target as part of ALL_BUILD.
     */
    auto cc = cm::make_unique<cmCustomCommand>();
    cmTarget* tgt =
      lg.AddUtilityCommand(CHECK_BUILD_SYSTEM_TARGET, true, std::move(cc));
    auto ptr = cm::make_unique<cmGeneratorTarget>(tgt, &lg);
    auto* gt = ptr.get();
    lg.AddGeneratorTarget(std::move(ptr));

    // Add the rule.
    cc = cm::make_unique<cmCustomCommand>();
    cc->SetOutputs(this->StampFile);
    cc->SetDepends(listFiles);
    cc->SetCommandLines(commandLines);
    cc->SetComment("Checking Build System");
    cc->SetCMP0116Status(cmPolicies::NEW);
    cc->SetEscapeOldStyle(false);
    cc->SetStdPipesUTF8(true);

    if (cmSourceFile* file =
          lg.AddCustomCommandToOutput(std::move(cc), true)) {
      gt->AddSource(file->ResolveFullPath());
    } else {
      cmSystemTools::Error("Error adding rule for " + this->StampFile);
    }
    // Organize in the "predefined targets" folder:
    if (this->UseFolderProperty()) {
      tgt->SetProperty("FOLDER", this->GetPredefinedTargetsFolder());
    }
  }

  return true;
}